

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheet.cpp
# Opt level: O2

void __thiscall Rml::StyleSheet::MergeStyleSheet(StyleSheet *this,StyleSheet *other_sheet)

{
  Keyframes *pKVar1;
  NamedDecorator *pNVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  type this_00;
  type this_01;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  SpritesheetList *this_02;
  SpritesheetList *this_03;
  const_iterator __begin1;
  Iter<true> local_40;
  
  StyleSheetNode::MergeHierarchy
            ((this->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl,
             (other_sheet->root)._M_t.
             super___uniq_ptr_impl<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::StyleSheetNode_*,_std::default_delete<Rml::StyleSheetNode>_>
             .super__Head_base<0UL,_Rml::StyleSheetNode_*,_false>._M_head_impl,
             this->specificity_offset);
  this->specificity_offset = this->specificity_offset + other_sheet->specificity_offset;
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->keyframes,(other_sheet->keyframes).mNumElements + (this->keyframes).mNumElements)
  ;
  local_40 = (Iter<true>)
             robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::cbegin(&other_sheet->keyframes);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (other_sheet->keyframes).mInfo;
  while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.mKeyVals !=
         pbVar3) {
    pKVar1 = (Keyframes *)((long)local_40.mKeyVals + 0x20);
    this_00 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::doCreateByKey<std::__cxx11::string_const&,Rml::Keyframes>
                        ((Table<true,80ul,std::__cxx11::string,Rml::Keyframes,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->keyframes,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.mKeyVals);
    Keyframes::operator=(this_00,pKVar1);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyframes,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<true>::operator++((Iter<true> *)&local_40);
  }
  robin_hood::detail::
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&this->named_decorator_map,
            (other_sheet->named_decorator_map).mNumElements +
            (this->named_decorator_map).mNumElements);
  local_40 = robin_hood::detail::
             Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::cbegin(&other_sheet->named_decorator_map);
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (other_sheet->named_decorator_map).mInfo;
  while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.mKeyVals !=
         pbVar3) {
    pNVar2 = (NamedDecorator *)((long)local_40.mKeyVals + 0x20);
    this_01 = robin_hood::detail::
              Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              ::doCreateByKey<std::__cxx11::string_const&,Rml::NamedDecorator>
                        ((Table<true,80ul,std::__cxx11::string,Rml::NamedDecorator,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                          *)&this->named_decorator_map,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.mKeyVals);
    NamedDecorator::operator=(this_01,pNVar2);
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::Iter<true>::operator++(&local_40);
  }
  this_03 = &this->spritesheet_list;
  sVar4 = SpritesheetList::NumSpriteSheets(this_03);
  this_02 = &other_sheet->spritesheet_list;
  sVar5 = SpritesheetList::NumSpriteSheets(this_02);
  sVar6 = SpritesheetList::NumSprites(this_03);
  sVar7 = SpritesheetList::NumSprites(this_02);
  SpritesheetList::Reserve(this_03,sVar4 + sVar5,sVar6 + sVar7);
  SpritesheetList::Merge(this_03,this_02);
  return;
}

Assistant:

void StyleSheet::MergeStyleSheet(const StyleSheet& other_sheet)
{
	RMLUI_ZoneScoped;

	root->MergeHierarchy(other_sheet.root.get(), specificity_offset);
	specificity_offset += other_sheet.specificity_offset;

	// Any matching @keyframe names are overridden as per CSS rules
	keyframes.reserve(keyframes.size() + other_sheet.keyframes.size());
	for (auto& other_keyframes : other_sheet.keyframes)
	{
		keyframes[other_keyframes.first] = other_keyframes.second;
	}

	// Copy over the decorators, and replace any matching decorator names from other_sheet
	named_decorator_map.reserve(named_decorator_map.size() + other_sheet.named_decorator_map.size());
	for (auto& other_decorator : other_sheet.named_decorator_map)
	{
		named_decorator_map[other_decorator.first] = other_decorator.second;
	}

	spritesheet_list.Reserve(spritesheet_list.NumSpriteSheets() + other_sheet.spritesheet_list.NumSpriteSheets(),
		spritesheet_list.NumSprites() + other_sheet.spritesheet_list.NumSprites());
	spritesheet_list.Merge(other_sheet.spritesheet_list);
}